

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_outer<ncnn::BinaryOp_x86_avx512_functor::binary_op_rsub>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int *piVar7;
  long *in_RDX;
  __m256 *in_RSI;
  float *x_00;
  long *in_RDI;
  float fVar8;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar9 [32];
  undefined8 uVar14;
  undefined1 auVar10 [32];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  __m128 afVar19;
  int x_7;
  __m128 _outp_5;
  __m128 _b_5;
  __m128 _p_5;
  int x_6;
  __m256 _outp_4;
  __m256 _b_4;
  __m256 _p_4;
  int x_5;
  __m512 _outp_3;
  __m512 _b_3;
  __m512 _p_3;
  int x_4;
  float *ptr1_1;
  int y1;
  int y_1;
  int z1;
  int z;
  float *outptr_1;
  float *ptr_1;
  int q;
  int x_3;
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  int x_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m256 _p_1;
  int x_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int x;
  float *outptr;
  float *ptr1;
  float *ptr;
  int y;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_rsub op;
  Mat *m;
  Mat *m_1;
  undefined4 in_stack_fffffffffffff500;
  undefined4 in_stack_fffffffffffff504;
  __m256 *in_stack_fffffffffffff508;
  __m256 *x_01;
  binary_op_rsub *in_stack_fffffffffffff510;
  binary_op_rsub *this;
  __m512 *in_stack_fffffffffffff520;
  __m512 *y_00;
  __m512 *in_stack_fffffffffffff528;
  binary_op_rsub *in_stack_fffffffffffff530;
  binary_op_rsub *this_00;
  int local_a84;
  float local_a70 [2];
  float afStack_a68 [2];
  float local_a60 [2];
  float afStack_a58 [5];
  int local_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  int local_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  int local_8d4;
  undefined8 local_8d0;
  float local_8c8 [6];
  float local_8b0 [2];
  float local_8a8;
  float local_8a4;
  float local_8a0;
  float local_89c;
  float local_898;
  undefined8 local_890;
  float *local_888;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  undefined8 local_868;
  undefined8 local_860;
  undefined8 local_858;
  undefined4 local_850;
  long local_848;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined8 local_828;
  float *local_820;
  undefined8 local_818;
  undefined8 local_810;
  undefined8 local_808;
  undefined4 local_800;
  long local_7f8;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined4 local_7e0;
  undefined8 local_7d8;
  float *local_7d0;
  int local_7c8;
  int local_7c4;
  undefined8 local_7c0;
  float afStack_7b8 [2];
  float local_7b0 [2];
  float afStack_7a8 [2];
  float local_7a0 [2];
  float afStack_798 [5];
  int local_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  int local_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  int local_60c;
  undefined1 (*local_608) [64];
  float *local_600;
  float *local_5f8;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  int local_5d8;
  binary_op_rsub local_5d1 [9];
  long *local_5c8;
  __m256 *local_5c0;
  long *local_5b8;
  undefined1 local_5ad;
  int local_5ac;
  undefined8 *local_5a0;
  undefined8 *local_598;
  __m256 *local_590;
  undefined8 *local_580;
  binary_op_rsub *local_578;
  __m512 *local_570;
  undefined1 local_565;
  int local_564;
  undefined8 *local_558;
  undefined8 *local_548;
  undefined1 local_540 [64];
  float local_4c4;
  undefined1 local_4c0 [64];
  float local_454;
  float *local_450;
  float *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  float *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 (*local_380) [64];
  float local_378;
  float local_374;
  float *local_370;
  float *local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  float *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 (*local_2e8) [64];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float local_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float local_2ac;
  long local_2a8;
  undefined4 local_29c;
  long local_298;
  float *local_290;
  undefined4 local_284;
  int local_280;
  int local_27c;
  undefined8 *local_278;
  long local_270;
  undefined4 local_264;
  long local_260;
  float *local_258;
  undefined4 local_24c;
  int local_248;
  int local_244;
  undefined8 *local_240;
  undefined4 local_234;
  long local_230;
  undefined4 local_224;
  long local_220;
  __m512 *local_200;
  binary_op_rsub *local_1f0;
  undefined8 *local_1e0;
  undefined1 local_1a0 [32];
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  undefined1 local_160 [32];
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  int local_10c;
  undefined8 *local_108;
  int local_fc;
  long *local_f8;
  int local_ec;
  long *local_e8;
  float *local_e0;
  float *local_d8;
  undefined8 local_d0;
  float afStack_c8 [4];
  float *local_b8;
  undefined8 local_b0;
  float afStack_a8 [2];
  undefined1 (*local_a0) [64];
  int local_94;
  undefined8 *local_88;
  float local_80 [3];
  float local_74;
  long local_70;
  long local_68;
  float local_60;
  float local_5c;
  binary_op_rsub *local_58;
  
  local_5d8 = *(int *)((long)in_RDI + 0x2c);
  local_5dc = (int)in_RDI[6];
  local_5e0 = *(int *)((long)in_RDI + 0x34);
  local_5e4 = (int)in_RDI[7];
  local_5e8 = (int)in_RDI[3];
  local_5c8 = in_RDX;
  local_5c0 = in_RSI;
  local_5b8 = in_RDI;
  if ((int)in_RDI[5] == 2) {
    for (local_5ec = 0; local_5ec < local_5dc; local_5ec = local_5ec + 1) {
      local_f8 = local_5b8;
      local_fc = local_5ec;
      local_5f8 = (float *)(*local_5b8 +
                           (long)*(int *)((long)local_5b8 + 0x2c) * (long)local_5ec * local_5b8[2]);
      local_590 = local_5c0;
      local_600 = *(float **)*local_5c0;
      local_e8 = local_5c8;
      local_ec = local_5ec;
      local_608 = (undefined1 (*) [64])
                  (*local_5c8 +
                  (long)*(int *)((long)local_5c8 + 0x2c) * (long)local_5ec * local_5c8[2]);
      if (local_5e8 == 0x10) {
        for (local_60c = 0; local_60c < local_5d8; local_60c = local_60c + 1) {
          local_448 = local_5f8;
          local_680 = *(undefined8 *)local_5f8;
          uStack_678 = *(undefined8 *)(local_5f8 + 2);
          uStack_670 = *(undefined8 *)(local_5f8 + 4);
          uStack_668 = *(undefined8 *)(local_5f8 + 6);
          uStack_660 = *(undefined8 *)(local_5f8 + 8);
          uStack_658 = *(undefined8 *)(local_5f8 + 10);
          uStack_650 = *(undefined8 *)(local_5f8 + 0xc);
          uStack_648 = *(undefined8 *)(local_5f8 + 0xe);
          local_454 = *local_600;
          local_4c0 = vbroadcastss_avx512f(ZEXT416((uint)local_454));
          local_6c0 = local_4c0._0_8_;
          uStack_6b8 = local_4c0._8_8_;
          uStack_6b0 = local_4c0._16_8_;
          uStack_6a8 = local_4c0._24_8_;
          uStack_6a0 = local_4c0._32_8_;
          uStack_698 = local_4c0._40_8_;
          uStack_690 = local_4c0._48_8_;
          uStack_688 = local_4c0._56_8_;
          uVar11 = local_4c0._0_8_;
          uVar12 = local_4c0._8_8_;
          uVar13 = local_4c0._16_8_;
          uVar14 = local_4c0._24_8_;
          uVar15 = local_4c0._32_8_;
          uVar16 = local_4c0._40_8_;
          uVar17 = local_4c0._48_8_;
          uVar18 = local_4c0._56_8_;
          BinaryOp_x86_avx512_functor::binary_op_rsub::func_pack16
                    (in_stack_fffffffffffff530,in_stack_fffffffffffff528,in_stack_fffffffffffff520);
          local_380 = local_608;
          auVar4._8_8_ = uVar12;
          auVar4._0_8_ = uVar11;
          auVar4._16_8_ = uVar13;
          auVar4._24_8_ = uVar14;
          auVar4._32_8_ = uVar15;
          auVar4._40_8_ = uVar16;
          auVar4._48_8_ = uVar17;
          auVar4._56_8_ = uVar18;
          *local_608 = auVar4;
          local_5f8 = local_5f8 + 0x10;
          local_600 = local_600 + 1;
          local_608 = local_608 + 1;
          local_700 = uVar11;
          uStack_6f8 = uVar12;
          uStack_6f0 = uVar13;
          uStack_6e8 = uVar14;
          uStack_6e0 = uVar15;
          uStack_6d8 = uVar16;
          uStack_6d0 = uVar17;
          uStack_6c8 = uVar18;
          local_3c0 = uVar11;
          uStack_3b8 = uVar12;
          uStack_3b0 = uVar13;
          uStack_3a8 = uVar14;
          uStack_3a0 = uVar15;
          uStack_398 = uVar16;
          uStack_390 = uVar17;
          uStack_388 = uVar18;
        }
      }
      if (local_5e8 == 8) {
        for (local_704 = 0; local_704 < local_5d8; local_704 = local_704 + 1) {
          local_368 = local_5f8;
          local_740 = *(undefined8 *)local_5f8;
          uStack_738 = *(undefined8 *)(local_5f8 + 2);
          uStack_730 = *(undefined8 *)(local_5f8 + 4);
          uStack_728 = *(undefined8 *)(local_5f8 + 6);
          local_374 = *local_600;
          auVar1 = vinsertps_avx(ZEXT416((uint)local_374),ZEXT416((uint)local_374),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_374),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_374),0x30);
          auVar2 = vinsertps_avx(ZEXT416((uint)local_374),ZEXT416((uint)local_374),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_374),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_374),0x30);
          auVar9._16_16_ = auVar1;
          auVar9._0_16_ = auVar2;
          local_1a0._0_8_ = auVar2._0_8_;
          local_1a0._8_8_ = auVar2._8_8_;
          local_1a0._16_8_ = auVar1._0_8_;
          local_1a0._24_8_ = auVar1._8_8_;
          local_760 = local_1a0._0_8_;
          uStack_758 = local_1a0._8_8_;
          uStack_750 = local_1a0._16_8_;
          uStack_748 = local_1a0._24_8_;
          uVar11 = local_1a0._0_8_;
          uVar12 = local_1a0._8_8_;
          uVar13 = local_1a0._16_8_;
          uVar14 = local_1a0._24_8_;
          local_1a0 = auVar9;
          local_180 = local_374;
          local_17c = local_374;
          local_178 = local_374;
          local_174 = local_374;
          local_170 = local_374;
          local_16c = local_374;
          local_168 = local_374;
          local_164 = local_374;
          BinaryOp_x86_avx512_functor::binary_op_rsub::func_pack8
                    (in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                     (__m256 *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500));
          local_2e8 = local_608;
          auVar6._8_8_ = uVar12;
          auVar6._0_8_ = uVar11;
          auVar6._16_8_ = uVar13;
          auVar6._24_8_ = uVar14;
          *(undefined1 (*) [32])*local_608 = auVar6;
          local_5f8 = local_5f8 + 8;
          local_600 = local_600 + 1;
          local_608 = (undefined1 (*) [64])(*local_608 + 0x20);
          local_780 = uVar11;
          uStack_778 = uVar12;
          uStack_770 = uVar13;
          uStack_768 = uVar14;
          local_320 = uVar11;
          uStack_318 = uVar12;
          uStack_310 = uVar13;
          uStack_308 = uVar14;
        }
      }
      if (local_5e8 == 4) {
        for (local_784 = 0; local_784 < local_5d8; local_784 = local_784 + 1) {
          local_d8 = local_5f8;
          local_7a0 = *(float (*) [2])local_5f8;
          afStack_798._0_8_ = *(undefined8 *)(local_5f8 + 2);
          local_2c0 = *local_600;
          local_7b0[1] = local_2c0;
          local_7b0[0] = local_2c0;
          uVar11._4_4_ = local_2c0;
          uVar11._0_4_ = local_2c0;
          afStack_7a8 = (float  [2])uVar11;
          fStack_2bc = local_2c0;
          fStack_2b8 = local_2c0;
          fStack_2b4 = local_2c0;
          local_2ac = local_2c0;
          afVar19 = BinaryOp_x86_avx512_functor::binary_op_rsub::func_pack4
                              (local_5d1,(__m128 *)local_7a0,(__m128 *)local_7b0);
          local_7c0 = afVar19._0_8_;
          local_a0 = local_608;
          auVar1._8_4_ = (float)uVar11;
          auVar1._12_4_ = SUB84(uVar11,4);
          auVar1._0_8_ = local_7c0;
          *(undefined1 (*) [16])*local_608 = auVar1;
          local_5f8 = local_5f8 + 4;
          local_600 = local_600 + 1;
          local_608 = (undefined1 (*) [64])(*local_608 + 0x10);
          afStack_7b8 = (float  [2])uVar11;
          local_b0 = local_7c0;
          afStack_a8 = (float  [2])uVar11;
        }
      }
      if (local_5e8 == 1) {
        for (local_7c4 = 0; local_7c4 < local_5d8; local_7c4 = local_7c4 + 1) {
          fVar8 = BinaryOp_x86_avx512_functor::binary_op_rsub::func(local_5d1,local_5f8,local_600);
          *(float *)*local_608 = fVar8;
          local_5f8 = local_5f8 + 1;
          local_600 = local_600 + 1;
          local_608 = (undefined1 (*) [64])(*local_608 + 4);
        }
      }
    }
  }
  if (((int)local_5b8[5] == 3) || ((int)local_5b8[5] == 4)) {
    for (local_7c8 = 0; local_7c8 < local_5e4; local_7c8 = local_7c8 + 1) {
      local_5a0 = &local_818;
      local_244 = *(int *)((long)local_5b8 + 0x2c);
      local_248 = (int)local_5b8[6];
      local_24c = *(undefined4 *)((long)local_5b8 + 0x34);
      local_7d0 = (float *)(*local_5b8 + local_5b8[8] * (long)local_7c8 * local_5b8[2]);
      local_260 = local_5b8[2];
      local_264 = (undefined4)local_5b8[3];
      local_270 = local_5b8[4];
      local_240 = &local_818;
      local_230 = (long)local_244 * (long)local_248 * local_260;
      local_598 = &local_818;
      local_580 = &local_818;
      local_558 = &local_868;
      local_27c = *(int *)((long)local_5c8 + 0x2c);
      local_280 = (int)local_5c8[6];
      local_284 = *(undefined4 *)((long)local_5c8 + 0x34);
      x_00 = (float *)(*local_5c8 + local_5c8[8] * (long)local_7c8 * local_5c8[2]);
      local_298 = local_5c8[2];
      local_29c = (undefined4)local_5c8[3];
      local_2a8 = local_5c8[4];
      local_278 = &local_868;
      local_220 = (long)local_27c * (long)local_280 * local_298;
      local_548 = &local_868;
      this_00 = (binary_op_rsub *)&local_868;
      local_7e0 = 0;
      local_7e4 = 0;
      local_7e8 = 0;
      local_7ec = 0;
      local_800 = 0;
      local_808 = 0;
      local_810 = 0;
      local_818 = 0;
      local_224 = 0x10;
      local_234 = 0x10;
      local_564 = local_7c8;
      local_565 = 1;
      local_5ac = local_7c8;
      local_5ad = 1;
      local_7d8 = 0;
      local_7f0 = 0;
      local_868 = 0;
      local_858 = 0;
      local_850 = 0;
      local_840 = 0;
      local_83c = 0;
      local_838 = 0;
      local_834 = 0;
      local_830 = 0;
      local_828 = 0;
      local_860 = 0;
      local_820 = x_00;
      local_578 = this_00;
      local_290 = x_00;
      local_258 = local_7d0;
      local_1f0 = this_00;
      local_1e0 = local_580;
      local_848 = local_2a8;
      local_7f8 = local_270;
      for (local_86c = 0; local_86c < local_5e0; local_86c = local_86c + 1) {
        local_874 = (int)local_5c0[1][5] + -1;
        piVar7 = std::min<int>(&local_86c,&local_874);
        local_870 = *piVar7;
        for (local_878 = 0; local_878 < local_5dc; local_878 = local_878 + 1) {
          local_880 = (int)local_5c0[1][4] + -1;
          piVar7 = std::min<int>(&local_878,&local_880);
          local_87c = *piVar7;
          local_88 = &local_8d0;
          local_5c = local_5c0[1][3];
          local_60 = local_5c0[1][4];
          local_68 = *(long *)*local_5c0 +
                     (long)(int)local_5c0[1][3] * (long)(int)local_5c0[1][4] * (long)local_870 *
                     *(long *)(*local_5c0 + 4);
          local_70 = *(long *)(*local_5c0 + 4);
          local_74 = (*local_5c0)[6];
          local_80._0_8_ = *(undefined8 *)local_5c0[1];
          this = (binary_op_rsub *)&local_8d0;
          local_108 = &local_8d0;
          local_888 = (float *)(local_68 + (long)(int)local_5c * (long)local_87c * local_70);
          y_00 = (__m512 *)&local_8d0;
          local_94 = local_870;
          local_8d0._0_4_ = 0.0;
          local_8d0._4_4_ = 0.0;
          local_8c8[2] = 0.0;
          local_8c8[3] = 0.0;
          local_8c8[4] = 0.0;
          local_8a8 = 0.0;
          local_8a4 = 0.0;
          local_8a0 = 0.0;
          local_89c = 0.0;
          local_898 = 0.0;
          local_890 = 0;
          local_8c8[0] = 0.0;
          local_8c8[1] = 0.0;
          x_01 = local_5c0;
          local_570 = y_00;
          local_200 = y_00;
          local_10c = local_87c;
          local_58 = this;
          local_8b0 = (float  [2])local_80._0_8_;
          if (local_5e8 == 0x10) {
            for (local_8d4 = 0; local_8d4 < local_5d8; local_8d4 = local_8d4 + 1) {
              local_450 = local_7d0;
              local_940 = *(undefined8 *)local_7d0;
              uStack_938 = *(undefined8 *)(local_7d0 + 2);
              uStack_930 = *(undefined8 *)(local_7d0 + 4);
              uStack_928 = *(undefined8 *)(local_7d0 + 6);
              uStack_920 = *(undefined8 *)(local_7d0 + 8);
              uStack_918 = *(undefined8 *)(local_7d0 + 10);
              uStack_910 = *(undefined8 *)(local_7d0 + 0xc);
              uStack_908 = *(undefined8 *)(local_7d0 + 0xe);
              local_4c4 = *local_888;
              local_540 = vbroadcastss_avx512f(ZEXT416((uint)local_4c4));
              local_980 = local_540._0_8_;
              uStack_978 = local_540._8_8_;
              uStack_970 = local_540._16_8_;
              uStack_968 = local_540._24_8_;
              uStack_960 = local_540._32_8_;
              uStack_958 = local_540._40_8_;
              uStack_950 = local_540._48_8_;
              uStack_948 = local_540._56_8_;
              uVar11 = local_540._0_8_;
              uVar12 = local_540._8_8_;
              uVar13 = local_540._16_8_;
              uVar14 = local_540._24_8_;
              uVar15 = local_540._32_8_;
              uVar16 = local_540._40_8_;
              uVar17 = local_540._48_8_;
              uVar18 = local_540._56_8_;
              BinaryOp_x86_avx512_functor::binary_op_rsub::func_pack16(this_00,(__m512 *)x_00,y_00);
              local_3c8 = local_820;
              auVar3._8_8_ = uVar12;
              auVar3._0_8_ = uVar11;
              auVar3._16_8_ = uVar13;
              auVar3._24_8_ = uVar14;
              auVar3._32_8_ = uVar15;
              auVar3._40_8_ = uVar16;
              auVar3._48_8_ = uVar17;
              auVar3._56_8_ = uVar18;
              *(undefined1 (*) [64])local_820 = auVar3;
              local_7d0 = local_7d0 + 0x10;
              local_888 = local_888 + 1;
              local_820 = local_820 + 0x10;
              local_9c0 = uVar11;
              uStack_9b8 = uVar12;
              uStack_9b0 = uVar13;
              uStack_9a8 = uVar14;
              uStack_9a0 = uVar15;
              uStack_998 = uVar16;
              uStack_990 = uVar17;
              uStack_988 = uVar18;
              local_440 = uVar11;
              uStack_438 = uVar12;
              uStack_430 = uVar13;
              uStack_428 = uVar14;
              uStack_420 = uVar15;
              uStack_418 = uVar16;
              uStack_410 = uVar17;
              uStack_408 = uVar18;
            }
          }
          if (local_5e8 == 8) {
            for (local_9c4 = 0; local_9c4 < local_5d8; local_9c4 = local_9c4 + 1) {
              local_370 = local_7d0;
              local_a00 = *(undefined8 *)local_7d0;
              uStack_9f8 = *(undefined8 *)(local_7d0 + 2);
              uStack_9f0 = *(undefined8 *)(local_7d0 + 4);
              uStack_9e8 = *(undefined8 *)(local_7d0 + 6);
              local_378 = *local_888;
              auVar1 = vinsertps_avx(ZEXT416((uint)local_378),ZEXT416((uint)local_378),0x10);
              auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_378),0x20);
              auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_378),0x30);
              auVar2 = vinsertps_avx(ZEXT416((uint)local_378),ZEXT416((uint)local_378),0x10);
              auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_378),0x20);
              auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_378),0x30);
              auVar10._16_16_ = auVar1;
              auVar10._0_16_ = auVar2;
              local_160._0_8_ = auVar2._0_8_;
              local_160._8_8_ = auVar2._8_8_;
              local_160._16_8_ = auVar1._0_8_;
              local_160._24_8_ = auVar1._8_8_;
              local_a20 = local_160._0_8_;
              uStack_a18 = local_160._8_8_;
              uStack_a10 = local_160._16_8_;
              uStack_a08 = local_160._24_8_;
              uVar11 = local_160._0_8_;
              uVar12 = local_160._8_8_;
              uVar13 = local_160._16_8_;
              uVar14 = local_160._24_8_;
              local_160 = auVar10;
              local_12c = local_378;
              local_128 = local_378;
              local_124 = local_378;
              local_120 = local_378;
              local_11c = local_378;
              local_118 = local_378;
              local_114 = local_378;
              local_110 = local_378;
              BinaryOp_x86_avx512_functor::binary_op_rsub::func_pack8
                        (this,x_01,(__m256 *)CONCAT44(local_378,in_stack_fffffffffffff500));
              local_328 = local_820;
              auVar5._8_8_ = uVar12;
              auVar5._0_8_ = uVar11;
              auVar5._16_8_ = uVar13;
              auVar5._24_8_ = uVar14;
              *(undefined1 (*) [32])local_820 = auVar5;
              local_7d0 = local_7d0 + 8;
              local_888 = local_888 + 1;
              local_820 = local_820 + 8;
              local_a40 = uVar11;
              uStack_a38 = uVar12;
              uStack_a30 = uVar13;
              uStack_a28 = uVar14;
              local_360 = uVar11;
              uStack_358 = uVar12;
              uStack_350 = uVar13;
              uStack_348 = uVar14;
            }
          }
          if (local_5e8 == 4) {
            for (local_a44 = 0; local_a44 < local_5d8; local_a44 = local_a44 + 1) {
              local_e0 = local_7d0;
              local_a60 = *(float (*) [2])local_7d0;
              afStack_a58._0_8_ = *(undefined8 *)(local_7d0 + 2);
              local_2e0 = *local_888;
              local_a70[1] = local_2e0;
              local_a70[0] = local_2e0;
              uVar12._4_4_ = local_2e0;
              uVar12._0_4_ = local_2e0;
              afStack_a68 = (float  [2])uVar12;
              fStack_2dc = local_2e0;
              fStack_2d8 = local_2e0;
              fStack_2d4 = local_2e0;
              local_2c4 = local_2e0;
              afVar19 = BinaryOp_x86_avx512_functor::binary_op_rsub::func_pack4
                                  (local_5d1,(__m128 *)local_a60,(__m128 *)local_a70);
              local_d0 = afVar19._0_8_;
              local_b8 = local_820;
              auVar2._8_4_ = (float)uVar12;
              auVar2._12_4_ = SUB84(uVar12,4);
              auVar2._0_8_ = local_d0;
              *(undefined1 (*) [16])local_820 = auVar2;
              local_7d0 = local_7d0 + 4;
              local_888 = local_888 + 1;
              local_820 = local_820 + 4;
              afStack_c8._0_8_ = uVar12;
            }
          }
          if (local_5e8 == 1) {
            for (local_a84 = 0; local_a84 < local_5d8; local_a84 = local_a84 + 1) {
              fVar8 = BinaryOp_x86_avx512_functor::binary_op_rsub::func
                                (local_5d1,local_7d0,local_888);
              *local_820 = fVar8;
              local_7d0 = local_7d0 + 1;
              local_888 = local_888 + 1;
              local_820 = local_820 + 1;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_outer(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;

    if (a.dims == 2)
    {
        // type 14
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(y);
            const float* ptr1 = b;
            float* outptr = c.row(y);

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (elempack == 16)
            {
                for (int x = 0; x < w; x++)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _b = _mm512_set1_ps(*ptr1);
                    __m512 _outp = op.func_pack16(_p, _b);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    ptr1 += 1;
                    outptr += 16;
                }
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
                for (int x = 0; x < w; x++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _b = _mm256_set1_ps(*ptr1);
                    __m256 _outp = op.func_pack8(_p, _b);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    ptr1 += 1;
                    outptr += 8;
                }
            }
#endif // __AVX__
            if (elempack == 4)
            {
                for (int x = 0; x < w; x++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _b = _mm_set1_ps(*ptr1);
                    __m128 _outp = op.func_pack4(_p, _b);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    ptr1 += 1;
                    outptr += 4;
                }
            }
#endif // __SSE2__
            if (elempack == 1)
            {
                for (int x = 0; x < w; x++)
                {
                    *outptr = op.func(*ptr, *ptr1);
                    ptr += 1;
                    ptr1 += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 3 || a.dims == 4)
    {
        // type 15 16 17 18 19
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            for (int z = 0; z < d; z++)
            {
                int z1 = std::min(z, b.d - 1);
                for (int y = 0; y < h; y++)
                {
                    int y1 = std::min(y, b.h - 1);

                    const float* ptr1 = b.depth(z1).row(y1);

#if __SSE2__
#if __AVX__
#if __AVX512F__
                    if (elempack == 16)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            __m512 _p = _mm512_loadu_ps(ptr);
                            __m512 _b = _mm512_set1_ps(*ptr1);
                            __m512 _outp = op.func_pack16(_p, _b);
                            _mm512_storeu_ps(outptr, _outp);
                            ptr += 16;
                            ptr1 += 1;
                            outptr += 16;
                        }
                    }
#endif // __AVX512F__
                    if (elempack == 8)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            __m256 _p = _mm256_loadu_ps(ptr);
                            __m256 _b = _mm256_set1_ps(*ptr1);
                            __m256 _outp = op.func_pack8(_p, _b);
                            _mm256_storeu_ps(outptr, _outp);
                            ptr += 8;
                            ptr1 += 1;
                            outptr += 8;
                        }
                    }
#endif // __AVX__
                    if (elempack == 4)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            __m128 _p = _mm_loadu_ps(ptr);
                            __m128 _b = _mm_set1_ps(*ptr1);
                            __m128 _outp = op.func_pack4(_p, _b);
                            _mm_storeu_ps(outptr, _outp);
                            ptr += 4;
                            ptr1 += 1;
                            outptr += 4;
                        }
                    }
#endif // __SSE2__
                    if (elempack == 1)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            *outptr = op.func(*ptr, *ptr1);
                            ptr += 1;
                            ptr1 += 1;
                            outptr += 1;
                        }
                    }
                }
            }
        }
    }

    return 0;
}